

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_sub_CC(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGTemp *a2;
  TCGTemp *ts;
  TCGArg TVar1;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  
  a2 = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a2 - (long)ctx);
  ts = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  tcg_gen_sub_i32((TCGContext_conflict9 *)ctx,ret_00,r1,r2);
  tcg_gen_setcond_i32_tricore
            ((TCGContext_conflict9 *)ctx,TCG_COND_GEU,*(TCGv_i32 *)&ctx[0x1c6].pc,r1,r2);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,
                      (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode,(TCGArg)a2,
                      (TCGArg)(r1 + (long)ctx));
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,(TCGArg)ts,
                      (TCGArg)(r1 + (long)ctx),(TCGArg)(r2 + (long)ctx));
  TVar1 = (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_and_i32,TVar1,TVar1,(TCGArg)ts);
  TVar1 = (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].hflags;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,
                      (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_add_i32,
                      (long)&(ctx->base).tb + ctx[0x1c6].features,(TCGArg)a2,(TCGArg)a2);
  TVar1 = (long)&(ctx->base).tb + ctx[0x1c6].features;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,TVar1,(TCGArg)a2,TVar1);
  TVar1 = (long)&(ctx->base).tb + (long)&(ctx[0x1c6].uc)->arch;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,
                      (long)&(ctx->base).tb + ctx[0x1c6].features);
  if (ret_00 != ret) {
    tcg_gen_op2_tricore((TCGContext_conflict9 *)ctx,INDEX_op_mov_i32,(TCGArg)(ret + (long)ctx),
                        (TCGArg)a2);
  }
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,(TCGTemp *)(ret_00 + (long)ctx));
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts);
  return;
}

Assistant:

static inline void gen_sub_CC(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv result = tcg_temp_new(tcg_ctx);
    TCGv temp = tcg_temp_new(tcg_ctx);

    tcg_gen_sub_tl(tcg_ctx, result, r1, r2);
    /* calc C bit */
    tcg_gen_setcond_tl(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_PSW_C, r1, r2);
    /* calc V bit */
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, result, r1);
    tcg_gen_xor_tl(tcg_ctx, temp, r1, r2);
    tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, temp);
    /* calc SV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
    /* Calc AV bit */
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, result);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, tcg_ctx->cpu_PSW_AV);
    /* calc SAV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    /* write back result */
    tcg_gen_mov_tl(tcg_ctx, ret, result);

    tcg_temp_free(tcg_ctx, result);
    tcg_temp_free(tcg_ctx, temp);
}